

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  void *in_RSI;
  AssertionResultData *in_RDI;
  AssertionResultData *in_stack_ffffffffffffffd8;
  
  memcpy(in_RDI,in_RSI,0x38);
  AssertionResultData::AssertionResultData(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData&& data )
    :   m_info( info ),
        m_resultData( CATCH_MOVE(data) )
    {}